

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime.hpp
# Opt level: O0

domain_manager * __thiscall
cs::domain_manager::add_buildin_var<char_const(&)[5]>
          (domain_manager *this,char (*name) [5],var *var)

{
  domain_manager *pdVar1;
  string *in_RDX;
  domain_manager *in_RSI;
  var *in_stack_00000090;
  char (*in_stack_00000098) [5];
  domain_manager *in_stack_000000a0;
  raw_hash_set<phmap::priv::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  allocator<char> local_39;
  string local_38 [32];
  
  this_00 = (raw_hash_set<phmap::priv::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_39;
  pdVar1 = in_RSI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,(char *)in_RSI,(allocator *)this_00);
  add_record(pdVar1,in_RDX);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator(&local_39);
  phmap::priv::
  raw_hash_set<phmap::priv::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::emplace<const_char_(&)[5],_0>(this_00,(char (*) [5])in_RSI);
  pdVar1 = add_var_global<char_const(&)[5]>(in_stack_000000a0,in_stack_00000098,in_stack_00000090);
  return pdVar1;
}

Assistant:

domain_manager &add_buildin_var(T &&name, const var &var)
		{
			add_record(name);
			buildin_symbols.emplace(name);
			return add_var_global(name, var);
		}